

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetFilenameWithoutExtension
                   (string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  size_type dot_pos;
  string name;
  string *filename_local;
  
  name.field_2._8_8_ = filename;
  GetFilenameName((string *)&dot_pos,filename);
  lVar1 = std::__cxx11::string::find((char)&dot_pos,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&dot_pos);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&dot_pos);
  }
  std::__cxx11::string::~string((string *)&dot_pos);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameWithoutExtension(const std::string& filename)
{
  std::string name = SystemTools::GetFilenameName(filename);
  std::string::size_type dot_pos = name.find('.');
  if(dot_pos != std::string::npos)
    {
    return name.substr(0, dot_pos);
    }
  else
    {
    return name;
    }
}